

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *p,Abc_Cex_t **ppCex,Vec_Int_t **pvMaps)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  Abc_Cex_t *pAVar5;
  uint uVar6;
  int f;
  int iVar7;
  int iVar8;
  
  p_00 = Vec_IntAlloc(1000);
  for (iVar7 = 0; iVar7 < p->vValues->nSize; iVar7 = iVar7 + 1) {
    pGVar1 = p->pGia;
    iVar2 = Vec_IntEntry(p->vValues,iVar7);
    pGVar4 = Gia_ManObj(pGVar1,iVar2);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if (iVar7 != 0) {
      iVar2 = Ga2_ObjIsAbs(p,pGVar4);
      if (iVar2 == 0) {
        if (-1 < *(long *)pGVar4) {
          __assert_fail("pObj->fPhase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                        ,0x4f1,
                        "void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)");
        }
        iVar2 = Ga2_ObjIsLeaf(p,pGVar4);
        if (iVar2 == 0) {
          __assert_fail("Ga2_ObjIsLeaf(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                        ,0x4f2,
                        "void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)");
        }
        uVar6 = ~*(uint *)pGVar4;
        if (((uVar6 & 0x9fffffff) != 0) && ((int)*(uint *)pGVar4 < 0 || (uVar6 & 0x1fffffff) == 0))
        {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                        ,0x4f3,
                        "void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)");
        }
        iVar2 = Gia_ObjId(p->pGia,pGVar4);
        Vec_IntPush(p_00,iVar2);
      }
    }
  }
  iVar7 = p_00->nSize;
  iVar8 = 0;
  pAVar5 = Abc_CexAlloc(0,iVar7,p->pPars->iFrame + 1);
  iVar2 = p->pPars->iFrame;
  pAVar5->iFrame = iVar2;
  f = 0;
  do {
    if (iVar2 < f) {
      *pvMaps = p_00;
      *ppCex = pAVar5;
      return;
    }
    for (iVar2 = 0; iVar2 < iVar7; iVar2 = iVar2 + 1) {
      pGVar1 = p->pGia;
      iVar3 = Vec_IntEntry(p_00,iVar2);
      pGVar4 = Gia_ManObj(pGVar1,iVar3);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar3 = Ga2_ObjSatValue(p,pGVar4,f);
      if (iVar3 != 0) {
        (&pAVar5[1].iPo)[iVar2 + iVar8 >> 5] =
             (&pAVar5[1].iPo)[iVar2 + iVar8 >> 5] | 1 << ((byte)(iVar2 + iVar8) & 0x1f);
      }
    }
    f = f + 1;
    iVar2 = p->pPars->iFrame;
    iVar8 = iVar8 + iVar7;
  } while( true );
}

Assistant:

void Ga2_GlaPrepareCexAndMap( Ga2_Man_t * p, Abc_Cex_t ** ppCex, Vec_Int_t ** pvMaps )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap;
    Gia_Obj_t * pObj;
    int f, i, k;
/*
    Gia_ManForEachObj( p->pGia, pObj, i )
        if ( Ga2_ObjId(p, pObj) >= 0 )
            assert( Vec_IntEntry(p->vValues, Ga2_ObjId(p, pObj)) == i );
*/
    // find PIs and PPIs
    vMap = Vec_IntAlloc( 1000 );
    Gia_ManForEachObjVec( p->vValues, p->pGia, pObj, i )
    {
        if ( !i ) continue;
        if ( Ga2_ObjIsAbs(p, pObj) )
            continue;
        assert( pObj->fPhase );
        assert( Ga2_ObjIsLeaf(p, pObj) );
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj) );
        Vec_IntPush( vMap, Gia_ObjId(p->pGia, pObj) );
    }
    // derive counter-example
    pCex = Abc_CexAlloc( 0, Vec_IntSize(vMap), p->pPars->iFrame+1 );
    pCex->iFrame = p->pPars->iFrame;
    for ( f = 0; f <= p->pPars->iFrame; f++ )
        Gia_ManForEachObjVec( vMap, p->pGia, pObj, k )
            if ( Ga2_ObjSatValue( p, pObj, f ) )
                Abc_InfoSetBit( pCex->pData, f * Vec_IntSize(vMap) + k );
    *pvMaps = vMap;
    *ppCex = pCex;
}